

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineOffsetCache.cpp
# Opt level: O2

uint32 __thiscall Js::LineOffsetCache::GetLineCount(LineOffsetCache *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *pRVar4;
  
  pRVar4 = (this->lineCharacterOffsetCacheList).ptr;
  if (pRVar4 == (ReadOnlyList<unsigned_int,_Memory::Recycler,_DefaultComparer> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/LineOffsetCache.cpp"
                                ,0x7b,"(this->lineCharacterOffsetCacheList != nullptr)",
                                "The list was either not set from the ByteCode or not created.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pRVar4 = (this->lineCharacterOffsetCacheList).ptr;
  }
  return pRVar4->count;
}

Assistant:

uint32 LineOffsetCache::GetLineCount() const
    {
        AssertMsg(this->lineCharacterOffsetCacheList != nullptr, "The list was either not set from the ByteCode or not created.");
        return this->lineCharacterOffsetCacheList->Count();
    }